

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::PropertyNode::saveOctave(PropertyNode *this,ostream *out)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  ostream *poVar5;
  void *pvVar6;
  ostream *poVar7;
  char *__nptr;
  PropertyNode *in_RSI;
  string *in_RDI;
  int i_1;
  int k;
  Matrixd tmp;
  istringstream in;
  Matrixd M;
  char *vp;
  size_t i;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  DMatrix<double> *in_stack_fffffffffffffd70;
  DMatrix<double> *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  DMatrix<double> *in_stack_fffffffffffffda8;
  int local_200;
  int local_1fc;
  DMatrix<double> *in_stack_fffffffffffffe08;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  istringstream local_1c8 [400];
  DMatrix<double> local_38;
  char *local_20;
  ostream *out_00;
  
  sVar3 = std::
          vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
          ::size((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                  *)(in_RDI + 0x40));
  if (sVar3 == 0) {
    lVar4 = std::__cxx11::string::size();
    if ((lVar4 != 0) && (lVar4 = std::__cxx11::string::size(), lVar4 != 0)) {
      local_20 = (char *)0x0;
      __nptr = (char *)std::__cxx11::string::c_str();
      strtod(__nptr,&local_20);
      if (*local_20 == '\0') {
        poVar5 = std::operator<<((ostream *)in_RSI,"# name: ");
        poVar5 = std::operator<<(poVar5,in_RDI);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)in_RSI,"# type: scalar");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)in_RSI,in_RDI + 0x20);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
      }
      else {
        gmath::DMatrix<double>::DMatrix
                  (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
        std::__cxx11::istringstream::istringstream(local_1c8,in_RDI + 0x20,_S_in);
        gmath::operator>>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        iVar1 = gmath::DMatrix<double>::rows(&local_38);
        if ((0 < iVar1) && (iVar1 = gmath::DMatrix<double>::cols(&local_38), 0 < iVar1)) {
          iVar1 = gmath::DMatrix<double>::rows(&local_38);
          if (iVar1 == 1) {
            gmath::DMatrix<double>::DMatrix
                      ((DMatrix<double> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       in_stack_fffffffffffffd78);
            gmath::transpose<double>(in_stack_fffffffffffffda8);
            gmath::DMatrix<double>::operator=
                      ((DMatrix<double> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       in_stack_fffffffffffffd78);
            gmath::DMatrix<double>::~DMatrix(in_stack_fffffffffffffd70);
            gmath::DMatrix<double>::~DMatrix(in_stack_fffffffffffffd70);
          }
          poVar5 = std::operator<<((ostream *)in_RSI,"# name: ");
          poVar5 = std::operator<<(poVar5,in_RDI);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)in_RSI,"# type: matrix");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)in_RSI,"# rows: ");
          iVar1 = gmath::DMatrix<double>::rows(&local_38);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar1);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)in_RSI,"# columns: ");
          iVar1 = gmath::DMatrix<double>::cols(&local_38);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar1);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          std::ios_base::precision
                    ((ios_base *)(&in_RSI->name + *(long *)(*(long *)in_RSI + -0x18)),0x10);
          for (local_1fc = 0; iVar1 = gmath::DMatrix<double>::rows(&local_38), local_1fc < iVar1;
              local_1fc = local_1fc + 1) {
            local_200 = 0;
            while (iVar1 = local_200, iVar2 = gmath::DMatrix<double>::cols(&local_38), iVar1 < iVar2
                  ) {
              poVar5 = std::operator<<((ostream *)in_RSI,' ');
              in_stack_fffffffffffffd70 =
                   (DMatrix<double> *)
                   gmath::DMatrix<double>::operator()(&local_38,local_1fc,local_200);
              std::ostream::operator<<(poVar5,*(double *)in_stack_fffffffffffffd70);
              local_200 = local_200 + 1;
            }
            std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          }
          std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::istringstream::~istringstream(local_1c8);
        gmath::DMatrix<double>::~DMatrix(in_stack_fffffffffffffd70);
      }
    }
  }
  else {
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      poVar5 = std::operator<<((ostream *)in_RSI,"# name: ");
      poVar5 = std::operator<<(poVar5,in_RDI);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)in_RSI,"# type: scalar struct");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)in_RSI,"# ndims: 2");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)in_RSI,"  1 1");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)in_RSI,"# length: ");
      sVar3 = std::
              vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
              ::size((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                      *)(in_RDI + 0x40));
      pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar3);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    poVar5 = (ostream *)0x0;
    while (out_00 = poVar5,
          poVar7 = (ostream *)
                   std::
                   vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                   ::size((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                           *)(in_RDI + 0x40)), poVar5 < poVar7) {
      std::
      vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
      ::operator[]((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                    *)(in_RDI + 0x40),(size_type)out_00);
      std::__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11be47);
      saveOctave(in_RSI,out_00);
      poVar5 = out_00 + 1;
    }
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void saveOctave(std::ostream &out) const
    {
      if (list.size() > 0)
      {
        if (name.size() > 0)
        {
          // add structure element
          out << "# name: " << name << std::endl;
          out << "# type: scalar struct" << std::endl;
          out << "# ndims: 2" << std::endl;
          out << "  1 1" << std::endl;
          out << "# length: " << list.size() << std::endl;
        }

        // store all children
        for (size_t i=0; i<list.size(); i++)
        {
          list[i]->saveOctave(out);
        }

        out << std::endl;
        out << std::endl;
      }
      else if (name.size() > 0 && value.size() > 0)
      {
        char *vp=0;
        std::strtod(value.c_str(), &vp);

        if (*vp == '\0')
        {
          // store scalar
          out << "# name: " << name << std::endl;
          out << "# type: scalar" << std::endl;
          out << value << std::endl;
          out << std::endl;
          out << std::endl;
        }
        else
        {
          try
          {
            gmath::Matrixd M;
            std::istringstream in(value);
            in >> M;

            if (M.rows() > 0 && M.cols() > 0)
            {
              if (M.rows() == 1)
              {
                // store vector always as column
                gmath::Matrixd tmp=M;
                M=gmath::transpose(tmp);
              }

              // store matrix
              out << "# name: " << name << std::endl;
              out << "# type: matrix" << std::endl;
              out << "# rows: " << M.rows() << std::endl;
              out << "# columns: " << M.cols() << std::endl;
              out.precision(16);

              for (int k=0; k<M.rows(); k++)
              {
                for (int i=0; i<M.cols(); i++)
                {
                  out << ' ' << M(k, i);
                }

                out << std::endl;
              }

              out << std::endl;
              out << std::endl;
            }
          }
          catch (...)
          { }
        }
      }
    }